

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::parseSettingsString(SoPlexBase<double> *this,char *string)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  size_t sVar6;
  SPxOut *pSVar7;
  ulong uVar8;
  Verbosity old_verbosity;
  Verbosity VVar9;
  byte *pbVar10;
  char *pcVar11;
  long lVar12;
  byte *pbVar13;
  undefined8 *puVar14;
  byte *__s1_00;
  byte *pbVar15;
  Verbosity old_verbosity_5;
  byte *__s1_01;
  double value;
  char parseString [500];
  string local_250;
  double local_230;
  byte local_228 [504];
  
  if (string == (char *)0x0) {
    return false;
  }
  spxSnprintf((char *)local_228,499,"%s",string);
  pbVar13 = local_228;
  do {
    pbVar13 = pbVar13 + 1;
    uVar8 = (ulong)pbVar13[-1];
    if (0x23 < uVar8) goto LAB_0019ff06;
  } while ((0x100002200U >> (uVar8 & 0x3f) & 1) != 0);
  if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
    return true;
  }
LAB_0019ff06:
  __s1 = pbVar13 + -1;
  __s1_00 = pbVar13;
  do {
    if ((byte)uVar8 < 0x3b) {
      if ((0x900002601U >> (uVar8 & 0x3f) & 1) != 0) {
        __s1_00[-1] = 0;
        pbVar15 = __s1_00;
        break;
      }
      if (uVar8 == 0x3a) goto LAB_0019ff7c;
    }
    uVar8 = (ulong)*__s1_00;
    __s1_00 = __s1_00 + 1;
  } while( true );
  while (bVar1 == 0x20) {
LAB_0019ff38:
    __s1_00 = pbVar15 + 1;
    bVar1 = *pbVar15;
    pbVar15 = __s1_00;
    if (bVar1 < 0x20) {
      if ((bVar1 != 9) && (bVar1 != 0xd)) goto LAB_0019ff5b;
      goto LAB_0019ff38;
    }
  }
  if (bVar1 != 0x3a) {
LAB_0019ff5b:
    VVar9 = (this->spxout).m_verbosity;
    if ((int)VVar9 < 3) {
      return false;
    }
    pSVar7 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar11 = "Error parsing setting string: no \':\' separating parameter type and name.\n";
    goto LAB_0019ff75;
  }
LAB_0019ff86:
  for (; uVar8 = (ulong)*__s1_00, pbVar15 = __s1_00, uVar8 < 0x24; __s1_00 = __s1_00 + 1) {
    if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
        VVar9 = (this->spxout).m_verbosity;
        if ((int)VVar9 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Error parsing setting string: no parameter name.\n",
                   0x31);
        goto LAB_0019ffce;
      }
      break;
    }
  }
  do {
    __s1_01 = pbVar15 + 1;
    if ((byte)uVar8 < 0x3e) {
      if ((0x900002601U >> (uVar8 & 0x3f) & 1) != 0) {
        *pbVar15 = 0;
        pbVar15 = __s1_01;
        goto LAB_001a000a;
      }
      if (uVar8 == 0x3d) goto LAB_001a004c;
    }
    uVar8 = (ulong)*__s1_01;
    pbVar15 = __s1_01;
  } while( true );
LAB_0019ff7c:
  __s1_00[-1] = 0;
  goto LAB_0019ff86;
  while (bVar1 == 0x20) {
LAB_001a000a:
    __s1_01 = pbVar15 + 1;
    bVar1 = *pbVar15;
    pbVar15 = __s1_01;
    if (bVar1 < 0x20) {
      if ((bVar1 != 9) && (bVar1 != 0xd)) goto LAB_001a002d;
      goto LAB_001a000a;
    }
  }
  if (bVar1 == 0x3d) goto LAB_001a0056;
LAB_001a002d:
  VVar9 = (this->spxout).m_verbosity;
  if ((int)VVar9 < 3) {
    return false;
  }
  pSVar7 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar11 = "Error parsing setting string: no \'=\' after parameter name.\n";
  goto LAB_0019ff75;
LAB_001a004c:
  *pbVar15 = 0;
LAB_001a0056:
  for (; uVar8 = (ulong)*__s1_01, pbVar15 = __s1_01, uVar8 < 0x24; __s1_01 = __s1_01 + 1) {
    if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) {
        VVar9 = (this->spxout).m_verbosity;
        if ((int)VVar9 < 3) {
          return false;
        }
        pSVar7 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar11 = "Error parsing setting string: no parameter value.\n";
        goto LAB_0019ff75;
      }
      break;
    }
  }
  do {
    pbVar10 = pbVar15 + 1;
    if ((byte)uVar8 < 0x24) {
      if ((0x900002600U >> (uVar8 & 0x3f) & 1) != 0) {
        *pbVar15 = 0;
        break;
      }
      if (uVar8 == 0) goto LAB_001a00f3;
    }
    uVar8 = (ulong)*pbVar10;
    pbVar15 = pbVar10;
  } while( true );
LAB_001a00c6:
  uVar8 = (ulong)*pbVar10;
  if (0x23 < uVar8) {
LAB_001a0200:
    VVar9 = (this->spxout).m_verbosity;
    if ((int)VVar9 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar7 = soplex::operator<<(&this->spxout,
                                "Error parsing setting string: additional character \'");
    local_250._M_dataplus._M_p._0_1_ = *pbVar10;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar7->m_streams[pSVar7->m_verbosity],(char *)&local_250,1);
    soplex::operator<<(pSVar7,"\' after parameter value.\n");
    (this->spxout).m_verbosity = VVar9;
    return false;
  }
  if ((0x100002200U >> (uVar8 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_001a00f3;
    goto LAB_001a0200;
  }
  pbVar10 = pbVar10 + 1;
  goto LAB_001a00c6;
LAB_001a00f3:
  iVar3 = strncmp((char *)__s1,"bool",4);
  if (iVar3 == 0) {
    puVar14 = &Settings::boolParam;
    lVar12 = 0;
    do {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
      if (iVar3 == 0) {
        iVar3 = strncasecmp((char *)__s1_01,"true",4);
        if ((((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"TRUE",4), iVar3 == 0)) ||
            (iVar3 = strncasecmp((char *)__s1_01,"t",4), iVar3 == 0)) ||
           ((iVar3 = strncasecmp((char *)__s1_01,"T",4), iVar3 == 0 ||
            (lVar4 = strtol((char *)__s1_01,(char **)0x0,4), lVar4 == 1)))) {
          bVar2 = true;
LAB_001a0337:
          bVar2 = setBoolParam(this,(BoolParam)lVar12,bVar2,true);
          if (bVar2) {
            return true;
          }
        }
        else {
          iVar3 = strncasecmp((char *)__s1_01,"false",5);
          if (((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"FALSE",5), iVar3 == 0)) ||
             ((iVar3 = strncasecmp((char *)__s1_01,"f",5), iVar3 == 0 ||
              ((iVar3 = strncasecmp((char *)__s1_01,"F",5), iVar3 == 0 ||
               (lVar4 = strtol((char *)__s1_01,(char **)0x0,5), lVar4 == 0)))))) {
            bVar2 = false;
            goto LAB_001a0337;
          }
        }
        VVar9 = (this->spxout).m_verbosity;
        if ((int)VVar9 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar7 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <");
        pSVar7 = soplex::operator<<(pSVar7,(char *)__s1_01);
        pcVar11 = "> for bool parameter <";
        goto LAB_001a059a;
      }
      lVar12 = lVar12 + 1;
      puVar14 = puVar14 + 4;
    } while (lVar12 != 0x1a);
LAB_001a0290:
    VVar9 = (this->spxout).m_verbosity;
    if ((int)VVar9 < 3) {
      return false;
    }
    pSVar7 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar11 = "Error parsing setting string: unknown parameter name <";
  }
  else {
    if (((*__s1 == 0x69) && (*pbVar13 == 0x6e)) && (pbVar13[1] == 0x74)) {
      puVar14 = &Settings::intParam;
      lVar12 = 0;
      do {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
        if (iVar3 == 0) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          sVar6 = strlen((char *)__s1_01);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,__s1_01,__s1_01 + sVar6);
          iVar3 = std::__cxx11::stoi(&local_250,(size_t *)0x0,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          bVar2 = setIntParam(this,(IntParam)lVar12,iVar3,false);
          if (bVar2) {
            return true;
          }
          VVar9 = (this->spxout).m_verbosity;
          if ((int)VVar9 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar7 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar7 = soplex::operator<<(pSVar7,(char *)__s1_01);
          pcVar11 = "> for int parameter <";
          goto LAB_001a059a;
        }
        lVar12 = lVar12 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar12 != 0x1c);
      goto LAB_001a0290;
    }
    iVar3 = strncmp((char *)__s1,"real",4);
    if (iVar3 == 0) {
      puVar14 = &Settings::realParam;
      lVar12 = 0;
      do {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar14,500);
        if (iVar3 == 0) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          sVar6 = strlen((char *)__s1_01);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,__s1_01,__s1_01 + sVar6);
          value = std::__cxx11::stod(&local_250,(size_t *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            local_230 = value;
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
            value = local_230;
          }
          bVar2 = setRealParam(this,(RealParam)lVar12,value,true);
          if (bVar2) {
            return true;
          }
          VVar9 = (this->spxout).m_verbosity;
          if ((int)VVar9 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar7 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar7 = soplex::operator<<(pSVar7,(char *)__s1_01);
          pcVar11 = "> for real parameter <";
          goto LAB_001a059a;
        }
        lVar12 = lVar12 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar12 != 0x1b);
      goto LAB_001a0290;
    }
    iVar3 = strncmp((char *)__s1,"uint",4);
    if (iVar3 == 0) {
      iVar3 = strncmp((char *)__s1_00,"random_seed",0xb);
      if (iVar3 == 0) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        sVar6 = strlen((char *)__s1_01);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,__s1_01,__s1_01 + sVar6);
        uVar5 = std::__cxx11::stoul(&local_250,(size_t *)0x0,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (uVar5 >> 0x20 != 0) {
          VVar9 = (this->spxout).m_verbosity;
          uVar5 = 0xffffffff;
          if (0 < (int)VVar9) {
            (this->spxout).m_verbosity = WARNING;
            soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n");
            (this->spxout).m_verbosity = VVar9;
          }
        }
        setRandomSeed(this,(uint)uVar5);
        return true;
      }
      VVar9 = (this->spxout).m_verbosity;
      if ((int)VVar9 < 3) {
        return false;
      }
      pSVar7 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar11 = "Error parsing setting string for uint parameter <random_seed>.\n";
      goto LAB_0019ff75;
    }
    VVar9 = (this->spxout).m_verbosity;
    if ((int)VVar9 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar7 = soplex::operator<<(&this->spxout,
                                "Error parsing setting string: invalid parameter type <");
    pSVar7 = soplex::operator<<(pSVar7,(char *)__s1);
    pcVar11 = "> for parameter <";
  }
LAB_001a059a:
  pSVar7 = soplex::operator<<(pSVar7,pcVar11);
  pSVar7 = soplex::operator<<(pSVar7,(char *)__s1_00);
  pcVar11 = ">.\n";
LAB_0019ff75:
  soplex::operator<<(pSVar7,pcVar11);
LAB_0019ffce:
  (this->spxout).m_verbosity = VVar9;
  return false;
}

Assistant:

bool SoPlexBase<R>::parseSettingsString(char* string)
{
   assert(string != nullptr);

   bool success = true;

   if(string == nullptr)
      return false;

   char parseString[SPX_SET_MAX_LINE_LEN];
   spxSnprintf(parseString, SPX_SET_MAX_LINE_LEN - 1, "%s", string);

   char* line = parseString;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing setting string: no ':' separating parameter type and name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter name.\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no '=' after parameter name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter value.\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: additional character '" << *line <<
                       "' after parameter value.\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a real parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;
#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for real parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << ">.\n");

   return false;
}